

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

void HighsHashTree<int,_void>::destroy_recurse(NodePtr node)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  int i;
  long lVar4;
  
  switch((uint)node.ptrAndType & 7) {
  case 1:
    puVar3 = *(undefined8 **)(node.ptrAndType & 0xfffffffffffffff8);
    operator_delete((undefined8 *)(node.ptrAndType & 0xfffffffffffffff8));
    while (puVar3 != (undefined8 *)0x0) {
      puVar1 = (undefined8 *)*puVar3;
      operator_delete(puVar3);
      puVar3 = puVar1;
    }
    return;
  case 2:
  case 3:
  case 4:
  case 5:
    break;
  case 6:
    uVar2 = *(undefined8 *)(node.ptrAndType & 0xfffffffffffffff8);
    for (lVar4 = 0; POPCOUNT(uVar2) != lVar4; lVar4 = lVar4 + 1) {
      destroy_recurse((NodePtr)((undefined8 *)(node.ptrAndType & 0xfffffffffffffff8))[lVar4 + 1]);
    }
    break;
  default:
    return;
  }
  operator_delete((void *)(node.ptrAndType & 0xfffffffffffffff8));
  return;
}

Assistant:

static void destroy_recurse(NodePtr node) {
    switch (node.getType()) {
      case kEmpty:
        break;
      case kListLeaf: {
        ListLeaf* leaf = node.getListLeaf();
        ListNode* iter = leaf->first.next;
        delete leaf;
        while (iter != nullptr) {
          ListNode* next = iter->next;
          delete iter;
          iter = next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        delete node.getInnerLeafSizeClass1();
        break;
      case kInnerLeafSizeClass2:
        delete node.getInnerLeafSizeClass2();
        break;
      case kInnerLeafSizeClass3:
        delete node.getInnerLeafSizeClass3();
        break;
      case kInnerLeafSizeClass4:
        delete node.getInnerLeafSizeClass4();
        break;
      case kBranchNode: {
        BranchNode* branch = node.getBranchNode();
        int size = branch->occupation.num_set();

        for (int i = 0; i < size; ++i) destroy_recurse(branch->child[i]);

        destroyBranchingNode(branch);
      }
    }
  }